

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_event_loop.cpp
# Opt level: O1

void __thiscall sock1::operator()(sock1 *this,error_code *e)

{
  undefined8 in_RAX;
  long *plVar1;
  ssize_t sVar2;
  char c;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  if (e->_M_value != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"!e",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
    plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x21);
    std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
    std::ostream::put((char)plVar1);
    std::ostream::flush();
    return_code = 1;
  }
  uStack_18._7_1_ = -1;
  sVar2 = recv(this->fd,(void *)((long)&uStack_18 + 7),1,0);
  if (this->counter == 10) {
    if ((int)sVar2 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"n==0",4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
      plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x25);
      std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
      std::ostream::put((char)plVar1);
      std::ostream::flush();
      return_code = 1;
    }
    booster::aio::io_service::stop();
    done = true;
  }
  else {
    if (this->counter != (int)uStack_18._7_1_) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"c==counter",10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
      plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x2a);
      std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
      std::ostream::put((char)plVar1);
      std::ostream::flush();
      return_code = 1;
    }
    this->counter = this->counter + 1;
    async_run(this);
  }
  return;
}

Assistant:

void operator()(booster::system::error_code const &e)
	{
		TEST(!e);
		char c=-1;
		int n = ::recv(fd,&c,1,0);
		if(counter == 10) {
			TEST(n==0);
			srv->stop();
			done=true;
		}
		else  {
			TEST(c==counter);
			counter++;
			async_run();
		}

	}